

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O1

void __thiscall Disa::Matrix_Sparse::resize(Matrix_Sparse *this,size_t *row,size_t *column)

{
  pointer puVar1;
  unsigned_long uVar2;
  pointer pdVar3;
  ulong *puVar4;
  pointer puVar5;
  long lVar6;
  pointer puVar7;
  ulong uVar8;
  size_t sVar9;
  iterator __beg;
  ulong uVar10;
  ulong uVar11;
  void *__dest;
  pointer pdVar12;
  long lVar13;
  ulong *__dest_00;
  unsigned_long local_38;
  
  puVar7 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar7;
  if ((lVar6 != 0) && (*row < (lVar6 >> 3) - 1U)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->column_index,puVar7[*row]);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->element_value,
               (this->row_non_zero).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[*row]);
  }
  puVar7 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start == puVar7) {
    local_38 = 0;
  }
  else {
    local_38 = puVar7[-1];
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->row_non_zero,*row + 1,&local_38);
  if ((*column < this->column_size) &&
     (puVar7 = (this->row_non_zero).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
     puVar1 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_finish,
     (long)puVar1 - (long)puVar7 != 8 && puVar1 != puVar7)) {
    lVar6 = 0;
    uVar10 = 0;
    do {
      puVar1 = (this->column_index).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = puVar7[uVar10 + 1];
      lVar13 = uVar2 - lVar6;
      __dest_00 = puVar1 + puVar7[uVar10];
      uVar8 = (long)(lVar13 * 8 + puVar7[uVar10] * -8) >> 3;
      if (0 < (long)uVar8) {
        do {
          uVar11 = uVar8 >> 1;
          uVar8 = ~uVar11 + uVar8;
          puVar4 = __dest_00 + uVar11 + 1;
          if (*column - 1 < __dest_00[uVar11]) {
            uVar8 = uVar11;
            puVar4 = __dest_00;
          }
          __dest_00 = puVar4;
        } while (0 < (long)uVar8);
      }
      puVar4 = puVar1 + lVar13;
      if (__dest_00 != puVar4) {
        sVar9 = (long)(this->column_index).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar4;
        if (sVar9 != 0) {
          memmove(__dest_00,puVar4,sVar9);
        }
        puVar7 = (this->column_index).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar5 = (pointer)(((long)puVar7 - (long)puVar4) + (long)__dest_00);
        if (puVar7 != puVar5) {
          (this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar5;
        }
        lVar6 = (long)__dest_00 - (long)puVar1;
        if (lVar6 != lVar13 * 8) {
          pdVar3 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pdVar12 = pdVar3 + lVar13;
          __dest = (void *)((long)pdVar3 + lVar6);
          sVar9 = (long)(this->element_value).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar12;
          if (sVar9 != 0) {
            memmove(__dest,pdVar12,sVar9);
          }
          pdVar3 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          pdVar12 = (pointer)((long)__dest + ((long)pdVar3 - (long)pdVar12));
          if (pdVar3 != pdVar12) {
            (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = pdVar12;
          }
        }
        lVar6 = uVar2 - (lVar6 >> 3);
      }
      uVar10 = uVar10 + 1;
      puVar7 = (this->row_non_zero).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar7[uVar10] = puVar7[uVar10] - lVar6;
      lVar13 = (long)(this->row_non_zero).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar7;
    } while ((lVar13 != 0) && (uVar10 < (lVar13 >> 3) - 1U));
  }
  this->column_size = *column;
  return;
}

Assistant:

void Matrix_Sparse::resize(const std::size_t& row, const std::size_t& column) {

  // resize rows first
  if(row < size_row()) {
    column_index.resize(row_non_zero[row]);
    element_value.resize(row_non_zero[row]);
  }
  row_non_zero.resize(row + 1, row_non_zero.empty() ? 0 : row_non_zero.back());

  // resize columns
  // Note: Since we may have to do column erases over multiple rows we do it directly here rather than use erase().
  if(column < size_column()) {
    std::size_t offset_loss = 0;
    FOR(i_row, size_row()) {
      const auto& iter_column_end = column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row + 1] - offset_loss);
      auto iter_column =
      std::upper_bound(column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row]), iter_column_end, column - 1);
      if(iter_column != iter_column_end) {
        const s_size_t& start_distance = std::distance(column_index.begin(), iter_column);
        const s_size_t& end_distance = std::distance(column_index.begin(), iter_column_end);
        column_index.erase(iter_column, iter_column_end);
        element_value.erase(element_value.begin() + start_distance, element_value.begin() + end_distance);
        offset_loss += end_distance - start_distance;
      }
      row_non_zero[i_row + 1] -= offset_loss;
    }
  }
  column_size = column;
}